

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

void __thiscall
icu_63::NFRuleSet::parseRules(NFRuleSet *this,UnicodeString *description,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint32_t uVar4;
  NFRule *pNVar5;
  int64_t iVar6;
  int64_t baseValue;
  NFRule *rule;
  int32_t i;
  int32_t rulesSize;
  int64_t defaultBaseValue;
  int32_t p;
  int local_64;
  undefined1 local_60 [4];
  int32_t oldP;
  UnicodeString currentDescription;
  UErrorCode *status_local;
  UnicodeString *description_local;
  NFRuleSet *this_local;
  
  currentDescription.fUnion._48_8_ = status;
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    NFRuleList::deleteAll(&this->rules);
    UnicodeString::UnicodeString((UnicodeString *)local_60);
    local_64 = 0;
    while (iVar3 = UnicodeString::length(description), local_64 < iVar3) {
      defaultBaseValue._0_4_ = UnicodeString::indexOf(description,L';',local_64);
      if ((int32_t)defaultBaseValue == -1) {
        defaultBaseValue._0_4_ = UnicodeString::length(description);
      }
      UnicodeString::setTo
                ((UnicodeString *)local_60,description,local_64,(int32_t)defaultBaseValue - local_64
                );
      pNVar5 = NFRuleList::last(&this->rules);
      NFRule::makeRules((UnicodeString *)local_60,this,pNVar5,this->owner,&this->rules,
                        (UErrorCode *)currentDescription.fUnion._48_8_);
      local_64 = (int32_t)defaultBaseValue + 1;
    }
    _i = 0;
    uVar4 = NFRuleList::size(&this->rules);
    for (rule._0_4_ = 0; (int)(uint32_t)rule < (int)uVar4; rule._0_4_ = (uint32_t)rule + 1) {
      pNVar5 = NFRuleList::operator[](&this->rules,(uint32_t)rule);
      iVar6 = NFRule::getBaseValue(pNVar5);
      if (iVar6 == 0) {
        NFRule::setBaseValue(pNVar5,_i,(UErrorCode *)currentDescription.fUnion._48_8_);
      }
      else {
        bVar1 = iVar6 < _i;
        _i = iVar6;
        if (bVar1) {
          *(undefined4 *)currentDescription.fUnion._48_8_ = 9;
          break;
        }
      }
      if (this->fIsFractionRuleSet == '\0') {
        _i = _i + 1;
      }
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_60);
  }
  return;
}

Assistant:

void
NFRuleSet::parseRules(UnicodeString& description, UErrorCode& status)
{
    // start by creating a Vector whose elements are Strings containing
    // the descriptions of the rules (one rule per element).  The rules
    // are separated by semicolons (there's no escape facility: ALL
    // semicolons are rule delimiters)

    if (U_FAILURE(status)) {
        return;
    }

    // ensure we are starting with an empty rule list
    rules.deleteAll();

    // dlf - the original code kept a separate description array for no reason,
    // so I got rid of it.  The loop was too complex so I simplified it.

    UnicodeString currentDescription;
    int32_t oldP = 0;
    while (oldP < description.length()) {
        int32_t p = description.indexOf(gSemicolon, oldP);
        if (p == -1) {
            p = description.length();
        }
        currentDescription.setTo(description, oldP, p - oldP);
        NFRule::makeRules(currentDescription, this, rules.last(), owner, rules, status);
        oldP = p + 1;
    }

    // for rules that didn't specify a base value, their base values
    // were initialized to 0.  Make another pass through the list and
    // set all those rules' base values.  We also remove any special
    // rules from the list and put them into their own member variables
    int64_t defaultBaseValue = 0;

    // (this isn't a for loop because we might be deleting items from
    // the vector-- we want to make sure we only increment i when
    // we _didn't_ delete aything from the vector)
    int32_t rulesSize = rules.size();
    for (int32_t i = 0; i < rulesSize; i++) {
        NFRule* rule = rules[i];
        int64_t baseValue = rule->getBaseValue();

        if (baseValue == 0) {
            // if the rule's base value is 0, fill in a default
            // base value (this will be 1 plus the preceding
            // rule's base value for regular rule sets, and the
            // same as the preceding rule's base value in fraction
            // rule sets)
            rule->setBaseValue(defaultBaseValue, status);
        }
        else {
            // if it's a regular rule that already knows its base value,
            // check to make sure the rules are in order, and update
            // the default base value for the next rule
            if (baseValue < defaultBaseValue) {
                // throw new IllegalArgumentException("Rules are not in order");
                status = U_PARSE_ERROR;
                return;
            }
            defaultBaseValue = baseValue;
        }
        if (!fIsFractionRuleSet) {
            ++defaultBaseValue;
        }
    }
}